

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFacetedBrepWithVoids,_1UL>::
         Construct(DB *db,LIST *params)

{
  IfcFacetedBrepWithVoids *in;
  
  in = (IfcFacetedBrepWithVoids *)operator_new(0x88);
  *(undefined ***)&in->field_0x70 = &PTR__Object_00836880;
  *(undefined8 *)&in->field_0x78 = 0;
  *(char **)&in->field_0x80 = "IfcFacetedBrepWithVoids";
  Assimp::IFC::Schema_2x3::IfcManifoldSolidBrep::IfcManifoldSolidBrep
            ((IfcManifoldSolidBrep *)in,&PTR_construction_vtable_24__008c5408);
  *(undefined8 *)&(in->super_IfcManifoldSolidBrep).field_0x50 = 0;
  (in->super_IfcManifoldSolidBrep).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcFacetedBrepWithVoids_008c5328;
  *(undefined ***)&in->field_0x70 = &PTR__IfcFacetedBrepWithVoids_008c53f0;
  *(undefined ***)
   &(in->super_IfcManifoldSolidBrep).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcFacetedBrepWithVoids_008c5350;
  *(undefined ***)
   &(in->super_IfcManifoldSolidBrep).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcFacetedBrepWithVoids_008c5378;
  *(undefined ***)
   &(in->super_IfcManifoldSolidBrep).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    field_0x30 = &PTR__IfcFacetedBrepWithVoids_008c53a0;
  *(undefined ***)&(in->super_IfcManifoldSolidBrep).field_0x48 =
       &PTR__IfcFacetedBrepWithVoids_008c53c8;
  *(undefined8 *)&(in->super_IfcManifoldSolidBrep).field_0x58 = 0;
  *(undefined8 *)&in->field_0x60 = 0;
  *(undefined8 *)&in->field_0x68 = 0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcFacetedBrepWithVoids>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcManifoldSolidBrep).super_IfcSolidModel.
                 super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcManifoldSolidBrep).super_IfcSolidModel.
               super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[0xfffffffffffffffd]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }